

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_realloc.h
# Opt level: O3

void __thiscall
vector_realloc<unsigned_char_*,_16U>::push_back
          (vector_realloc<unsigned_char_*,_16U> *this,uchar **t)

{
  uchar **__ptr;
  size_t sVar1;
  size_t sVar2;
  
  __ptr = this->_data;
  sVar1 = this->_size;
  if (sVar1 == this->_capacity) {
    sVar2 = 0x10;
    if (sVar1 * 2 != 0) {
      sVar2 = sVar1 * 2;
    }
    this->_capacity = sVar2;
    __ptr = (uchar **)realloc(__ptr,sVar2 << 3);
    this->_data = __ptr;
    sVar1 = this->_size;
  }
  __ptr[sVar1] = *t;
  this->_size = sVar1 + 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (_size == _capacity) { grow(); }
		_data[_size] = t;
		++_size;
	}